

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O3

void __thiscall HAXX_BINARY_OP::quaternion_binary_add::test_method(quaternion_binary_add *this)

{
  check_is_close_t local_289;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  assertion_result local_258;
  undefined **local_240;
  undefined1 local_238;
  undefined8 *local_230;
  char *local_228;
  undefined **local_220;
  undefined1 local_218;
  undefined8 *local_210;
  undefined8 **local_208;
  undefined **local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  undefined8 **local_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  undefined8 **local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xd5);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_278 = 0xc010000000000000;
  local_280 = 0xc010000000000000;
  local_288 = 0x3d719799812dea11;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,-4.0,-4.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_268 = &local_280;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_270;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xd5,1,8,3,"r.real()",&local_1e0,"p.real() + q.real()"
             ,&local_200,"::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xd6);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x4021e147ae147ae2;
  local_280 = 0x4021e147ae147ae2;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,8.940000000000001,8.940000000000001,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xd6,1,8,3,"r.imag_i()",&local_1e0,
             "p.imag_i() + q.imag_i()",&local_200,"::boost::math::fpc::percent_tolerance(1e-12)",
             &local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0xd7);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x4025a3d70a3d70a4;
  local_280 = 0x4025a3d70a3d70a4;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,10.82,10.82,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xd7,1,8,3,"r.imag_j()",&local_1e0,
             "p.imag_j() + q.imag_j()",&local_200,"::boost::math::fpc::percent_tolerance(1e-12)",
             &local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xd8);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0xc010000000000000;
  local_280 = 0xc010000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,-4.0,-4.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xd8,1,8,3,"r.imag_k()",&local_1e0,
             "p.imag_k() + q.imag_k()",&local_200,"::boost::math::fpc::percent_tolerance(1e-12)",
             &local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0xda);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x3ff0000000000000;
  local_280 = 0x3ff0000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,1.0,1.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xda,1,8,3,"q.real()",&local_1e0,"1.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0xdb);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x4000000000000000;
  local_280 = 0x4000000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,2.0,2.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xdb,1,8,3,"q.imag_i()",&local_1e0,"2.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0xdc);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x4008000000000000;
  local_280 = 0x4008000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,3.0,3.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xdc,1,8,3,"q.imag_j()",&local_1e0,"3.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0xdd);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x4010000000000000;
  local_280 = 0x4010000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,4.0,4.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xdd,1,8,3,"q.imag_k()",&local_1e0,"4.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0xdf);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0xc014000000000000;
  local_280 = 0xc014000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,-5.0,-5.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xdf,1,8,3,"p.real()",&local_1e0,"-5.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0xe0);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x401bc28f5c28f5c3;
  local_280 = 0x401bc28f5c28f5c3;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,6.94,6.94,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xe0,1,8,3,"p.imag_i()",&local_1e0,"6.94",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0xe1);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0x401f47ae147ae148;
  local_280 = 0x401f47ae147ae148;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,7.82,7.82,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_268 = &local_280;
  local_1f8 = 0;
  local_218 = 0;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e8 = &local_268;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xe1,1,8,3,"p.imag_j()",&local_1e0,"7.82",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0xe2);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00150bb0;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_278 = 0xc020000000000000;
  local_280 = 0xc020000000000000;
  local_288 = 0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_258,&local_289,-8.0,-8.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_260 = &local_278;
  local_1c8 = &local_260;
  local_268 = &local_280;
  local_1d8 = 0;
  local_1f8 = 0;
  local_218 = 0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1b8 = "";
  local_1e0 = &PTR__lazy_ostream_00150bf0;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_288;
  local_1e8 = &local_268;
  local_200 = &PTR__lazy_ostream_00150bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &PTR__lazy_ostream_00150c90;
  local_208 = &local_270;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_240,&local_1c0,0xe2,1,8,3,"p.imag_k()",&local_1e0,"-8.",&local_200,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_220);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_binary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(-5.,6.94,7.82,-8.),r;
  r = p + q;

  BOOST_CHECK_CLOSE(r.real()  ,p.real()   + q.real()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),p.imag_i() + q.imag_i(), COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),p.imag_j() + q.imag_j(), COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),p.imag_k() + q.imag_k(), COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),1.  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);

  BOOST_CHECK_CLOSE(p.real()  ,-5. , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),6.94, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),7.82, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),-8. , COMPARE_TOL);


}